

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Barcode.cpp
# Opt level: O3

string * __thiscall ZXing::Result::ecLevel_abi_cxx11_(string *__return_storage_ptr__,Result *this)

{
  size_t sVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar1 = strlen(this->_ecLevel);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,this->_ecLevel,this->_ecLevel + sVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string Result::ecLevel() const
{
	return _ecLevel;
}